

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_lsr_16_pi(void)

{
  uint address;
  uint uVar1;
  
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = address + 2;
  uVar1 = m68ki_read_16_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,uVar1 >> 1);
  m68ki_cpu.n_flag = 0;
  m68ki_cpu.not_z_flag = uVar1 >> 1;
  m68ki_cpu.x_flag = uVar1 << 8;
  m68ki_cpu.c_flag = uVar1 << 8;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_lsr_16_pi(void)
{
	uint ea = EA_AY_PI_16();
	uint src = m68ki_read_16(ea);
	uint res = src >> 1;

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_CLEAR;
	FLAG_Z = res;
	FLAG_C = FLAG_X = src << 8;
	FLAG_V = VFLAG_CLEAR;
}